

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_singletons.c
# Opt level: O2

lu_int __thiscall lu_singletons(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  int *piVar1;
  double abstol;
  uint m;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double *Lx;
  double *Lx_00;
  double *Ux;
  double *Btx;
  lu_int *Lp;
  lu_int *Ui;
  double *Ux_00;
  lu_int *Up;
  lu_int *Ui_00;
  double *col_pivot;
  double *Bx_00;
  lu_int *Bti;
  lu_int *Bti_00;
  bool bVar6;
  lu_int lVar7;
  lu_int *pinv;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  lu_int *iset;
  lu_int *in_stack_ffffffffffffff38;
  
  m = *(uint *)((long)this + 0x54);
  lVar11 = (long)(int)m;
  iVar9 = *this;
  iVar2 = *(int *)((long)this + 8);
  abstol = *(double *)((long)this + 0x18);
  iVar3 = *(int *)((long)this + 0x28);
  Lx = *(double **)((long)this + 600);
  Lx_00 = *(double **)((long)this + 0x268);
  Ux = *(double **)((long)this + 0x278);
  Btx = *(double **)((long)this + 0x280);
  Lp = *(lu_int **)((long)this + 0x2a8);
  bVar6 = true;
  Ui = *(lu_int **)((long)this + 0x1a0);
  Ux_00 = *(double **)((long)this + 0x1b8);
  Up = *(lu_int **)((long)this + 0x1a8);
  Ui_00 = *(lu_int **)((long)this + 0x1c0);
  col_pivot = *(double **)((long)this + 0x210);
  Bx_00 = *(double **)((long)this + 0x218);
  Bti = *(lu_int **)((long)this + 0x1b0);
  Bti_00 = *(lu_int **)((long)this + 0x1c8);
  lVar13 = 0;
  iVar16 = 0;
  while ((lVar13 < lVar11 && (bVar6))) {
    iVar12 = Bend[lVar13];
    iVar4 = Bbegin[lVar13];
    iVar14 = iVar12 - iVar4;
    bVar6 = iVar4 <= iVar12;
    if (iVar12 < iVar4) {
      iVar14 = 0;
    }
    iVar16 = iVar16 + iVar14;
    lVar13 = lVar13 + 1;
  }
  if (bVar6) {
    if (iVar16 - iVar9 != 0 && iVar9 <= iVar16) {
      *(int *)((long)this + 0x58) = iVar16 - iVar9;
    }
    lVar7 = 1;
    iVar12 = iVar16 - *(int *)((long)this + 4);
    if (iVar12 == 0 || iVar16 < *(int *)((long)this + 4)) {
      if (iVar16 <= iVar2) {
        if (iVar9 < iVar16) {
          return 1;
        }
        pinv = (lu_int *)(lVar11 * 4 + (long)col_pivot);
        lVar13 = 0;
        memset(col_pivot,0,lVar11 * 4);
        bVar6 = true;
        while ((lVar13 < lVar11 && (bVar6))) {
          bVar6 = true;
          for (lVar10 = (long)Bbegin[lVar13]; (bVar6 && (lVar10 < Bend[lVar13]));
              lVar10 = lVar10 + 1) {
            uVar5 = Bi[lVar10];
            bVar6 = (int)uVar5 < (int)m && -1 < (int)uVar5;
            if (bVar6) {
              piVar1 = (int *)((long)col_pivot + (ulong)uVar5 * 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          lVar13 = lVar13 + 1;
        }
        if (bVar6) {
          uVar8 = 0;
          uVar15 = 0;
          if (0 < (int)m) {
            uVar15 = (ulong)m;
          }
          iVar9 = 0;
          for (; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            *(int *)((long)Bx_00 + uVar8 * 4) = iVar9;
            iVar2 = *(int *)((long)col_pivot + uVar8 * 4);
            *(int *)((long)col_pivot + uVar8 * 4) = iVar9;
            iVar9 = iVar2 + iVar9;
          }
          *(int *)((long)Bx_00 + lVar11 * 4) = iVar9;
          bVar6 = true;
          for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
            for (lVar11 = (long)Bbegin[uVar8]; lVar11 < Bend[uVar8]; lVar11 = lVar11 + 1) {
              lVar10 = (long)Bi[lVar11];
              iVar9 = *(int *)((long)col_pivot + lVar10 * 4);
              lVar13 = (long)iVar9;
              *(int *)((long)col_pivot + lVar10 * 4) = iVar9 + 1;
              Bti[lVar13] = (lu_int)uVar8;
              *(double *)(Bti_00 + lVar13 * 2) = Bx[lVar11];
              if ((*(int *)((long)Bx_00 + lVar10 * 4) < iVar9) && (uVar8 == (uint)Bti[lVar13 + -1]))
              {
                bVar6 = false;
              }
            }
          }
          if (!bVar6) {
            return -4;
          }
          for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            *(undefined4 *)((long)Lx + uVar8 * 4) = 0xffffffff;
          }
          for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            *(undefined4 *)((long)Lx_00 + uVar8 * 4) = 0xffffffff;
          }
          *(undefined4 *)Btx = 0;
          *(undefined4 *)Ux = 0;
          if (iVar3 < 0) {
            lVar7 = singleton_rows(m,Bbegin,Bend,Bi,Bx,(lu_int *)Bx_00,Bti,Btx,(lu_int *)Ux,Ui,Ux_00
                                   ,Lp,(lu_int *)Lx,Lx_00,col_pivot,pinv,(lu_int *)0x0,
                                   (lu_int *)0xfffffffffffffffc,in_stack_ffffffffffffff38,
                                   (lu_int)Bbegin,abstol);
            lVar7 = singleton_cols(m,Bbegin,Bend,Bi,Bx_00,Bti,Bti_00,Btx,Up,Ui_00,Ux,Ui,Lp,Lx,Lx_00,
                                   (lu_int *)col_pivot,pinv,
                                   (lu_int *)CONCAT44(extraout_var_00,lVar7),
                                   in_stack_ffffffffffffff38,(lu_int)Bbegin,abstol);
          }
          else {
            iset = (lu_int *)0x0;
            lVar7 = singleton_cols(m,Bbegin,Bend,Bi,Bx_00,Bti,Bti_00,Btx,Up,Ui_00,Ux,Ui,Lp,Lx,Lx_00,
                                   (lu_int *)col_pivot,pinv,(lu_int *)0x0,in_stack_ffffffffffffff38,
                                   (lu_int)Bbegin,abstol);
            lVar7 = singleton_rows(m,Bbegin,Bend,Bi,Bx,(lu_int *)Bx_00,Bti,Btx,(lu_int *)Ux,Ui,Ux_00
                                   ,Lp,(lu_int *)Lx,Lx_00,col_pivot,pinv,
                                   (lu_int *)CONCAT44(extraout_var,lVar7),iset,
                                   in_stack_ffffffffffffff38,(lu_int)Bbegin,abstol);
          }
          for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            if (*(int *)((long)Lx + uVar8 * 4) < 0) {
              *(undefined4 *)((long)Lx + uVar8 * 4) = 0xffffffff;
            }
          }
          for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            if (*(int *)((long)Lx_00 + uVar8 * 4) < 0) {
              *(undefined4 *)((long)Lx_00 + uVar8 * 4) = 0xffffffff;
            }
          }
          *(int *)((long)this + 0x138) = iVar16;
          *(lu_int *)((long)this + 0x13c) = lVar7;
          return 0;
        }
        goto LAB_003956d4;
      }
    }
    else {
      *(int *)((long)this + 0x5c) = iVar12;
      if (iVar16 <= iVar2) {
        return 1;
      }
    }
    *(int *)((long)this + 0x60) = iVar16 - iVar2;
  }
  else {
LAB_003956d4:
    lVar7 = -4;
  }
  return lVar7;
}

Assistant:

lu_int lu_singletons(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m      = this->m;
    const lu_int Lmem   = this->Lmem;
    const lu_int Umem   = this->Umem;
    const lu_int Wmem   = this->Wmem;
    const double abstol = this->abstol;
    const lu_int nzbias = this->nzbias;
    lu_int *pinv        = this->pinv;
    lu_int *qinv        = this->qinv;
    lu_int *Lbegin_p    = this->Lbegin_p;
    lu_int *Ubegin      = this->Ubegin;
    double *col_pivot   = this->col_pivot;
    lu_int *Lindex      = this->Lindex;
    double *Lvalue      = this->Lvalue;
    lu_int *Uindex      = this->Uindex;
    double *Uvalue      = this->Uvalue;
    lu_int *iwork1      = this->iwork1;
    lu_int *iwork2      = iwork1 + m;

    lu_int *Btp         = this->Wbegin; /* build B rowwise in W */
    lu_int *Bti         = this->Windex;
    double *Btx         = this->Wvalue;

    lu_int i, j, pos, put, rank, Bnz, ok;

    /* -------------------------------- */
    /* Check matrix and build transpose */
    /* -------------------------------- */

    /* Check pointers and count nnz(B). */
    Bnz = 0;
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        if (Bend[j] < Bbegin[j])
            ok = 0;
        else
            Bnz += Bend[j] - Bbegin[j];
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Check if sufficient memory in L, U, W. */
    ok = 1;
    if (Lmem < Bnz) { this->addmemL = Bnz-Lmem; ok = 0; }
    if (Umem < Bnz) { this->addmemU = Bnz-Umem; ok = 0; }
    if (Wmem < Bnz) { this->addmemW = Bnz-Wmem; ok = 0; }
    if (!ok)
        return BASICLU_REALLOCATE;

    /* Count nz per row, check indices. */
    memset(iwork1, 0, m*sizeof(lu_int)); /* row counts */
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        for (pos = Bbegin[j]; pos < Bend[j] && ok; pos++)
        {
            i = Bi[pos];
            if (i < 0 || i >= m)
                ok = 0;
            else
                iwork1[i]++;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Pack matrix rowwise, check for duplicates. */
    put = 0;
    for (i = 0; i < m; i++)     /* set row pointers */
    {
        Btp[i] = put;
        put += iwork1[i];
        iwork1[i] = Btp[i];
    }
    Btp[m] = put;
    assert(put == Bnz);
    ok = 1;
    for (j = 0; j < m; j++)     /* fill rows */
    {
        for (pos = Bbegin[j]; pos < Bend[j]; pos++)
        {
            i = Bi[pos];
            put = iwork1[i]++;
            Bti[put] = j;
            Btx[put] = Bx [pos];
            if (put > Btp[i] && Bti[put-1] == j)
                ok = 0;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* ---------------- */
    /* Pivot singletons */
    /* ---------------- */

    /* No pivot rows or pivot columns so far. */
    for (i = 0; i < m; i++)
        pinv[i] = -1;
    for (j = 0; j < m; j++)
        qinv[j] = -1;

    if (nzbias >= 0)            /* put more in U */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }
    else                        /* put more in L */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }

    /* pinv, qinv were used as nonzero counters. Reset to -1 if not pivoted. */
    for (i = 0; i < m; i++)
        if (pinv[i] < 0)
            pinv[i] = -1;
    for (j = 0; j < m; j++)
        if (qinv[j] < 0)
            qinv[j] = -1;

    this->matrix_nz = Bnz;
    this->rank = rank;
    return BASICLU_OK;
}